

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O3

void http_rd_submit(nni_http_conn *conn,nni_aio *aio,read_flavor flavor)

{
  _Bool _Var1;
  
  nni_aio_reset(aio);
  if (conn->closed == true) {
    nni_aio_finish_error(aio,NNG_ECLOSED);
    return;
  }
  _Var1 = nni_aio_start(aio,http_rd_cancel,conn);
  if (_Var1) {
    conn->rd_flavor = flavor;
    nni_list_append(&conn->rdq,aio);
    if (conn->rd_uaio == (nni_aio *)0x0) {
      http_rd_start(conn);
      return;
    }
  }
  return;
}

Assistant:

static void
http_rd_submit(nni_http_conn *conn, nni_aio *aio, enum read_flavor flavor)
{
	nni_aio_reset(aio);
	if (conn->closed) {
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if (!nni_aio_start(aio, http_rd_cancel, conn)) {
		return;
	}
	conn->rd_flavor = flavor;
	nni_list_append(&conn->rdq, aio);
	if (conn->rd_uaio == NULL) {
		http_rd_start(conn);
	}
}